

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_input_rewind(mpc_input_t *i)

{
  undefined8 *puVar1;
  int *in_RDI;
  
  if (0 < in_RDI[0x13]) {
    puVar1 = (undefined8 *)(*(long *)(in_RDI + 0x16) + (long)(in_RDI[0x15] + -1) * 0x20);
    *(undefined8 *)(in_RDI + 4) = *puVar1;
    *(undefined8 *)(in_RDI + 6) = puVar1[1];
    *(undefined8 *)(in_RDI + 8) = puVar1[2];
    *(undefined8 *)(in_RDI + 10) = puVar1[3];
    *(undefined1 *)(in_RDI + 0x1a) =
         *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(in_RDI[0x15] + -1));
    if (*in_RDI == 1) {
      fseek(*(FILE **)(in_RDI + 0x10),*(long *)(in_RDI + 4),0);
    }
    mpc_input_unmark(i);
  }
  return;
}

Assistant:

static void mpc_input_rewind(mpc_input_t *i) {

  if (i->backtrack < 1) { return; }

  i->state = i->marks[i->marks_num-1];
  i->last  = i->lasts[i->marks_num-1];

  if (i->type == MPC_INPUT_FILE) {
    fseek(i->file, i->state.pos, SEEK_SET);
  }

  mpc_input_unmark(i);
}